

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O1

bool __thiscall TGAImage::unload_rle_data(TGAImage *this,ofstream *out)

{
  ulong uVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  byte bVar8;
  
  uVar6 = (ulong)(this->height * this->width);
  uVar1 = 0;
  do {
    uVar9 = uVar1;
    if (uVar6 <= uVar9) goto LAB_001046b0;
    uVar1 = (ulong)this->bytespp;
    puVar2 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = puVar2 + (uVar9 + 1) * uVar1;
    puVar2 = puVar2 + uVar9 * uVar1;
    bVar7 = 1;
    bVar4 = true;
    do {
      if (((char)bVar7 < '\0') || (uVar6 <= bVar7 + uVar9)) break;
      if (uVar1 == 0) {
        bVar11 = true;
      }
      else {
        uVar5 = 1;
        do {
          bVar11 = puVar2[uVar5 - 1] == puVar3[uVar5 - 1];
          if (!bVar11) break;
          bVar10 = uVar5 < uVar1;
          uVar5 = uVar5 + 1;
        } while (bVar10);
      }
      bVar10 = (bool)(bVar11 ^ 1);
      if (bVar7 != 1) {
        bVar10 = bVar4;
      }
      bVar4 = bVar10;
      bVar8 = bVar11 | bVar4;
      if (bVar4 != false) {
        bVar8 = 0xff;
      }
      if (bVar11 == false) {
        bVar8 = bVar11 | bVar4;
      }
      bVar7 = bVar8 + bVar7;
      puVar3 = puVar3 + uVar1;
      puVar2 = puVar2 + uVar1;
    } while (bVar11 != bVar4);
    std::ostream::put((char)out);
    if (*(int *)(out + *(long *)(*(long *)out + -0x18) + 0x20) != 0) break;
    std::ostream::write((char *)out,
                        (long)((this->data).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar9 * uVar1));
    uVar1 = bVar7 + uVar9;
  } while (*(int *)(out + *(long *)(*(long *)out + -0x18) + 0x20) == 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"can\'t dump the tga file\n",0x18);
LAB_001046b0:
  return uVar6 <= uVar9;
}

Assistant:

bool TGAImage::unload_rle_data(std::ofstream &out) const
{
    const std::uint8_t max_chunk_length = 128;
    size_t n_pixels = width * height;
    size_t curpix = 0;
    while (curpix < n_pixels) {
        size_t chunkstart = curpix * bytespp;
        size_t curbyte = curpix * bytespp;
        std::uint8_t run_length = 1;
        bool raw = true;
        while (curpix + run_length < n_pixels && run_length < max_chunk_length) {
            bool succ_eq = true;
            for (size_t t = 0; succ_eq && t < bytespp; t++)
                succ_eq = (data[curbyte + t] == data[curbyte + t + bytespp]);
            curbyte += bytespp;
            if (1 == run_length) raw = !succ_eq;
            if (raw && succ_eq) {
                run_length--;
                break;
            }
            if (!raw && !succ_eq) break;
            run_length++;
        }
        curpix += run_length;
        out.put(raw ? run_length - 1 : run_length + 127);
        if (!out.good()) {
            std::cerr << "can't dump the tga file\n";
            return false;
        }
        out.write(reinterpret_cast<const char *>(data.data() + chunkstart),
                  (raw ? run_length * bytespp : bytespp));
        if (!out.good()) {
            std::cerr << "can't dump the tga file\n";
            return false;
        }
    }
    return true;
}